

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByName(FileDescriptor *this,string *key)

{
  char *__s1;
  long lVar1;
  ulong uVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  FieldDescriptor *pFVar7;
  long *plVar8;
  long lVar9;
  char *pcVar10;
  long *plVar11;
  
  __s1 = (key->_M_dataplus)._M_p;
  cVar4 = *__s1;
  if (cVar4 == '\0') {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    pcVar10 = __s1;
    do {
      pcVar10 = pcVar10 + 1;
      lVar9 = (long)cVar4 + lVar9 * 5;
      cVar4 = *pcVar10;
    } while (cVar4 != '\0');
  }
  lVar1 = *(long *)(*(long *)(this + 0x90) + 8);
  uVar2 = *(ulong *)(*(long *)(this + 0x90) + 0x10);
  plVar8 = *(long **)(lVar1 + ((ulong)((long)this * 0xffff + lVar9) % uVar2) * 8);
  plVar11 = (long *)0x0;
  if (plVar8 != (long *)0x0) {
    do {
      if (((FileDescriptor *)*plVar8 == this) &&
         (iVar5 = strcmp(__s1,(char *)plVar8[1]), plVar11 = plVar8, iVar5 == 0)) break;
      plVar8 = (long *)plVar8[4];
      plVar11 = (long *)0x0;
    } while (plVar8 != (long *)0x0);
  }
  if (plVar11 == (long *)0x0) {
    plVar11 = *(long **)(lVar1 + uVar2 * 8);
  }
  plVar3 = *(long **)(lVar1 + uVar2 * 8);
  plVar8 = plVar11 + 2;
  plVar6 = plVar8;
  if (plVar11 == plVar3) {
    plVar6 = (long *)&(anonymous_namespace)::kNullSymbol;
  }
  if (((int)*plVar6 == 2) || ((anonymous_namespace)::kNullSymbol != 0)) {
    if (plVar11 == plVar3) {
      plVar8 = (long *)&(anonymous_namespace)::kNullSymbol;
    }
    if ((int)*plVar6 != 2) {
      plVar8 = (long *)&(anonymous_namespace)::kNullSymbol;
    }
    pFVar7 = (FieldDescriptor *)0x0;
    if (((FieldDescriptor *)plVar8[1])[0x34] != (FieldDescriptor)0x0) {
      pFVar7 = (FieldDescriptor *)plVar8[1];
    }
  }
  else {
    pFVar7 = (FieldDescriptor *)0x0;
  }
  return pFVar7;
}

Assistant:

const FieldDescriptor*
FileDescriptor::FindExtensionByName(const string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}